

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ansv.cpp
# Opt level: O2

void par_test_ansv_localidx<unsigned_long,1,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,comm *c)

{
  unsigned_long uVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  char *expected_predicate_value;
  ulong uVar6;
  AssertHelper local_f0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertionResult gtest_ar_;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vec;
  string local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> right_nsv;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_nsv;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  lr_mins;
  
  mxx::impl::distribute_container<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  stable_distribute(&vec,in,c);
  local_b8._M_dataplus._M_p =
       (pointer)((long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                 (long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                       .super__Vector_impl_data._M_start >> 3);
  uVar1 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_b8,c);
  left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lr_mins.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lr_mins.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lr_mins.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  expected_predicate_value = (char *)0xffffffffffffffff;
  ansv<unsigned_long,1,1,1>(&vec,&left_nsv,&right_nsv,&lr_mins,c,0xffffffffffffffff);
  gtest_ar_.success_ =
       mxx::all_of((long)right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                   (long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start &&
                   (long)left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start ==
                   (long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,c);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    puVar2 = vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (uVar6 = 0; uVar4 = (long)puVar3 - (long)puVar2 >> 3, uVar6 < uVar4; uVar6 = uVar6 + 1) {
      uVar5 = left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      if (uVar5 != 0xffffffffffffffff) {
        if (uVar5 < uVar4) {
          left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = uVar5 + uVar1;
        }
        else {
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_.success_ =
               uVar5 < ((long)lr_mins.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)lr_mins.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) + uVar4;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_b8,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "left_nsv[i] >= vec.size() && left_nsv[i] < vec.size()+lr_mins.size()",
                       "false","true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0xb4,local_b8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            std::__cxx11::string::~string((string *)&local_b8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_e8);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] =
               lr_mins.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6] -
                ((ulong)((long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3)].second;
          puVar2 = vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
      }
      uVar4 = right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      if (uVar4 != 0xffffffffffffffff) {
        uVar5 = (long)puVar3 - (long)puVar2 >> 3;
        if (uVar4 < uVar5) {
          right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] = uVar4 + uVar1;
        }
        else {
          gtest_ar_.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          gtest_ar_.success_ =
               uVar4 < ((long)lr_mins.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)lr_mins.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4) + uVar5;
          if (!gtest_ar_.success_) {
            testing::Message::Message((Message *)&local_e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_b8,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "right_nsv[i] >= vec.size() && right_nsv[i] < vec.size()+lr_mins.size()",
                       "false","true",expected_predicate_value);
            testing::internal::AssertHelper::AssertHelper
                      (&local_f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
                       ,0xbe,local_b8._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
            testing::internal::AssertHelper::~AssertHelper(&local_f0);
            std::__cxx11::string::~string((string *)&local_b8);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_e8);
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_.message_);
          right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] =
               lr_mins.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6] -
                ((ulong)((long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3)].second;
          puVar2 = vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
      }
    }
    mxx::gatherv<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,&left_nsv,0,c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&left_nsv,&local_b8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
    mxx::gatherv<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,&right_nsv,0,c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&right_nsv,&local_b8)
    ;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
    if (c->m_rank == 0) {
      check_ansv<unsigned_long,1>(in,&left_nsv,true,0xffffffffffffffff);
      check_ansv<unsigned_long,1>(in,&right_nsv,false,0xffffffffffffffff);
    }
  }
  else {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)&gtest_ar_,
               (AssertionResult *)
               "mxx::all_of(vec.size() == left_nsv.size() && vec.size() == right_nsv.size(), c)",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/test/test_ansv.cpp"
               ,0xa3,local_b8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
  }
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base(&lr_mins.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&right_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&left_nsv.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&vec.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void par_test_ansv_localidx(const std::vector<T>& in, const mxx::comm& c) {
    std::vector<size_t> vec = mxx::stable_distribute(in, c);

    size_t prefix = mxx::exscan(vec.size(), c);

    // calc ansv
    std::vector<size_t> left_nsv;
    std::vector<size_t> right_nsv;
    std::vector<std::pair<T, size_t>> lr_mins;

    const size_t nonsv = std::numeric_limits<size_t>::max();
    ansv<T,left_type,right_type,local_indexing>(vec, left_nsv, right_nsv, lr_mins, c, nonsv);
    ASSERT_TRUE(mxx::all_of(vec.size() == left_nsv.size() && vec.size() == right_nsv.size(), c));

    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: in=" << in << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: vec=" << vec << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: left=" << left_nsv << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: right=" << right_nsv << std::endl;
    //mxx::sync_cout(c) << "[rank " << c.rank() << "]: lrmin=" << lr_mins << std::endl;

    // resolve local indexing into global indexing
    // FIXME: now we actually have to use a special value for non-matched
    for (size_t i = 0; i < vec.size(); ++i) {
        // resolve left
        if (left_nsv[i] != nonsv) {
            if (left_nsv[i] < vec.size()) {
                // this is a local element, add prefix
                left_nsv[i] += prefix;
            } else {
                EXPECT_TRUE(left_nsv[i] >= vec.size() && left_nsv[i] < vec.size()+lr_mins.size());
                left_nsv[i] = lr_mins[left_nsv[i]-vec.size()].second;
            }
        }
        // resolve right
        if (right_nsv[i] != nonsv) {
            if (right_nsv[i] < vec.size()) {
                // this is a local element, add prefix
                right_nsv[i] += prefix;
            } else {
                EXPECT_TRUE(right_nsv[i] >= vec.size() && right_nsv[i] < vec.size()+lr_mins.size());
                right_nsv[i] = lr_mins[right_nsv[i]-vec.size()].second;
            }
        }
    }


    left_nsv = mxx::gatherv(left_nsv, 0, c);
    right_nsv = mxx::gatherv(right_nsv, 0, c);

    if (c.rank() == 0) {
        check_ansv<T,left_type>(in, left_nsv, true, nonsv);
        check_ansv<T,right_type>(in, right_nsv, false, nonsv);
    }
}